

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_set_length(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  ulong idx;
  vm_val_t nil_val;
  
  if (getp_set_length(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_set_length(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar1 != 0) {
      getp_set_length::desc.min_argc_ = 1;
      getp_set_length::desc.opt_argc_ = 0;
      getp_set_length::desc.varargs_ = 0;
      __cxa_guard_release(&getp_set_length(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_set_length::desc);
  if (iVar1 == 0) {
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    idx = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    uVar2 = CVmBif::pop_long_val();
    if (0xfffe < uVar2) {
      err_throw(0x902);
    }
    set_element_count_undo(this,self,(ulong)uVar2);
    nil_val.typ = VM_NIL;
    for (; idx < uVar2; idx = idx + 1) {
      set_element(this,idx,&nil_val);
    }
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_set_length(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    size_t old_len;
    int32_t new_len;
    int32_t idx;
    vm_val_t nil_val;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the return value is 'self' */
    retval->set_obj(self);

    /* note the old length */
    old_len = get_element_count();

    /* get the new length */
    new_len = CVmBif::pop_long_val(vmg0_);

    /* can't go less than zero */
    if (new_len < 0 || new_len >= VEC_MAX_ELEMENTS)
        err_throw(VMERR_BAD_VAL_BIF);

    /* set the vector to its new size */
    set_element_count_undo(vmg_ self, (size_t)new_len);

    /* 
     *   Set each newly added element to nil.  Note that we don't bother
     *   saving undo for these changes: to undo this change, the only thing
     *   we'll have to do is reduce the vector size to its previous size,
     *   and we've already saved undo for the size change.  
     */
    nil_val.set_nil();
    for (idx = old_len ; idx < new_len ; ++idx)
        set_element((size_t)idx, &nil_val);

    /* handled */
    return TRUE;
}